

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_AfterProtocMaximumEditionExperimentalEditions_Test::
CommandLineInterfaceTest_AfterProtocMaximumEditionExperimentalEditions_Test
          (CommandLineInterfaceTest_AfterProtocMaximumEditionExperimentalEditions_Test *this)

{
  CommandLineInterfaceTest_AfterProtocMaximumEditionExperimentalEditions_Test *this_local;
  
  CommandLineInterfaceTest::CommandLineInterfaceTest(&this->super_CommandLineInterfaceTest);
  (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.super_Test._vptr_Test =
       (_func_int **)
       &PTR__CommandLineInterfaceTest_AfterProtocMaximumEditionExperimentalEditions_Test_029fb038;
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest,
       AfterProtocMaximumEditionExperimentalEditions) {
  CreateTempFile("foo.proto",
                 R"schema(
    edition = "2024";
    package foo;
    message Foo {
    }
  )schema");

  Run("protocol_compiler --experimental_editions --proto_path=$tmpdir "
      "--test_out=$tmpdir foo.proto");
  ExpectNoErrors();
}